

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::fixEraseViolation(treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    *this,node *x)

{
  treeNode<ft::pair<const_int,_int>_> **pptVar1;
  node *pnVar2;
  treeNode<ft::pair<const_int,_int>_> *x_00;
  treeNode<ft::pair<const_int,_int>_> *x_01;
  treeNode<ft::pair<const_int,_int>_> **pptVar3;
  
  if ((this->m_tree).m_root != x) {
    pptVar1 = &(this->m_tree).m_root;
    do {
      if (x->colour != BLACK) break;
      pptVar3 = &x->parent;
      pnVar2 = x->parent;
      x_01 = pnVar2->left;
      x_00 = pnVar2->right;
      if (x == x_01) {
        if (x_00->colour == RED) {
          x_00->colour = BLACK;
          pnVar2->colour = RED;
          rotateLeft(this,pnVar2);
          x_00 = (*pptVar3)->right;
        }
        if ((x_00->left->colour == BLACK) && (x_00->right->colour == BLACK)) {
          x_00->colour = RED;
        }
        else {
          if (x_00->right->colour == BLACK) {
            x_00->left->colour = BLACK;
            x_00->colour = RED;
            rotateRight(this,x_00);
            x_00 = (*pptVar3)->right;
          }
          pnVar2 = *pptVar3;
          x_00->colour = pnVar2->colour;
          pnVar2->colour = BLACK;
          x_00->right->colour = BLACK;
          rotateLeft(this,pnVar2);
          pptVar3 = pptVar1;
        }
LAB_0010be42:
        x = *pptVar3;
      }
      else if (x == x_00) {
        if (x_01->colour == RED) {
          x_01->colour = BLACK;
          pnVar2->colour = RED;
          rotateRight(this,pnVar2);
          x_01 = (*pptVar3)->left;
        }
        if ((x_01->right->colour == BLACK) && (x_01->left->colour == BLACK)) {
          x_01->colour = RED;
        }
        else {
          if (x_01->left->colour == BLACK) {
            x_01->right->colour = BLACK;
            x_01->colour = RED;
            rotateLeft(this,x_01);
            x_01 = (*pptVar3)->left;
          }
          pnVar2 = *pptVar3;
          x_01->colour = pnVar2->colour;
          pnVar2->colour = BLACK;
          x_01->left->colour = BLACK;
          rotateRight(this,pnVar2);
          pptVar3 = pptVar1;
        }
        goto LAB_0010be42;
      }
    } while (x != *pptVar1);
  }
  x->colour = BLACK;
  return;
}

Assistant:

void	fixEraseViolation(node* x)
	{
		while (x != this->root() && x->colour == BLACK)
		{
			if (x == x->parent->left)
			{
				node*	w = x->parent->right;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateLeft(x->parent);
					w = x->parent->right;
				}
				if (w->left->colour == BLACK && w->right->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->right->colour == BLACK)
					{
						w->left->colour = BLACK;
						w->colour = RED;
						this->rotateRight(w);
						w = x->parent->right;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->right->colour = BLACK;
					this->rotateLeft(x->parent);
					x = this->root();
				}
			}
			else if (x == x->parent->right)
			{
				node*	w = x->parent->left;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateRight(x->parent);
					w = x->parent->left;
				}
				if (w->right->colour == BLACK && w->left->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->left->colour == BLACK)
					{
						w->right->colour = BLACK;
						w->colour = RED;
						this->rotateLeft(w);
						w = x->parent->left;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->left->colour = BLACK;
					this->rotateRight(x->parent);
					x = this->root();
				}
			}
		}
		x->colour = BLACK;
	}